

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_read_header_format(p_ply ply)

{
  int iVar1;
  e_ply_storage_mode eVar2;
  e_ply_storage_mode eVar3;
  p_ply ply_local;
  
  if (((ply != (p_ply)0x0) && (ply->fp != (FILE *)0x0)) && (ply->io_mode == PLY_READ)) {
    iVar1 = strcmp(ply->buffer + ply->buffer_token,"format");
    if (iVar1 == 0) {
      iVar1 = ply_read_word(ply);
      if (iVar1 == 0) {
        ply_local._4_4_ = 0;
      }
      else {
        eVar2 = ply_find_string(ply->buffer + ply->buffer_token,ply_storage_mode_list);
        ply->storage_mode = eVar2;
        if (ply->storage_mode == ~PLY_BIG_ENDIAN) {
          ply_local._4_4_ = 0;
        }
        else {
          if (ply->storage_mode == PLY_ASCII) {
            ply->idriver = &ply_idriver_ascii;
          }
          else {
            eVar2 = ply->storage_mode;
            eVar3 = ply_arch_endian();
            if (eVar2 == eVar3) {
              ply->idriver = &ply_idriver_binary;
            }
            else {
              ply->idriver = &ply_idriver_binary_reverse;
            }
          }
          iVar1 = ply_read_word(ply);
          if (iVar1 == 0) {
            ply_local._4_4_ = 0;
          }
          else {
            iVar1 = strcmp(ply->buffer + ply->buffer_token,"1.0");
            if (iVar1 == 0) {
              iVar1 = ply_read_word(ply);
              if (iVar1 == 0) {
                ply_local._4_4_ = 0;
              }
              else {
                ply_local._4_4_ = 1;
              }
            }
            else {
              ply_local._4_4_ = 0;
            }
          }
        }
      }
    }
    else {
      ply_local._4_4_ = 0;
    }
    return ply_local._4_4_;
  }
  __assert_fail("ply && ply->fp && ply->io_mode == PLY_READ",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x4ae,"int ply_read_header_format(p_ply)");
}

Assistant:

static int ply_read_header_format(p_ply ply) {
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    if (strcmp(BWORD(ply), "format")) return 0;
    if (!ply_read_word(ply)) return 0;
    ply->storage_mode = ply_find_string(BWORD(ply), ply_storage_mode_list);
    if (ply->storage_mode == (e_ply_storage_mode) (-1)) return 0;
    if (ply->storage_mode == PLY_ASCII) ply->idriver = &ply_idriver_ascii;
    else if (ply->storage_mode == ply_arch_endian())
        ply->idriver = &ply_idriver_binary;
    else ply->idriver = &ply_idriver_binary_reverse;
    if (!ply_read_word(ply)) return 0;
    if (strcmp(BWORD(ply), "1.0")) return 0;
    if (!ply_read_word(ply)) return 0;
    return 1;
}